

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O0

void __thiscall
onmt::SentencePieceLearner::SentencePieceLearner
          (SentencePieceLearner *this,bool verbose,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *opts,string *input_filename,bool keep_vocab,bool keep_input_file)

{
  size_type sVar1;
  byte bVar2;
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [16];
  Tokenizer *in_stack_ffffffffffffffb0;
  bool in_stack_ffffffffffffffbf;
  SubwordLearner *in_stack_ffffffffffffffc0;
  ulong uVar3;
  ulong __n;
  
  bVar2 = (byte)in_R8D;
  SubwordLearner::SubwordLearner
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__SentencePieceLearner_006efc08;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 4);
  std::__cxx11::string::string((string *)__lhs);
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RCX);
  *(byte *)(in_RDI + 0xc) = bVar2 & 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xd);
  std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::
  unique_ptr<std::default_delete<std::ofstream>,void>
            ((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
              *)__rhs);
  *(byte *)(in_RDI + 0xe) = in_R9B & 1;
  uVar3 = 0;
  while( true ) {
    __n = uVar3;
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDX);
    if (sVar1 <= uVar3) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDX,__n);
    std::operator+(__lhs,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffff40));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDX,__n + 1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_R8D,in_stack_ffffffffffffff28),__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_R8D,in_stack_ffffffffffffff28),(char *)__rhs);
    std::__cxx11::string::operator+=((string *)(in_RDI + 4),local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    uVar3 = __n + 2;
  }
  return;
}

Assistant:

SentencePieceLearner::SentencePieceLearner(bool verbose,
                                             const std::vector<std::string>& opts,
                                             const std::string& input_filename,
                                             bool keep_vocab,
                                             bool keep_input_file)
    : SubwordLearner(verbose)
    , _input_filename(input_filename)
    , _keep_vocab(keep_vocab)
    , _keep_input_file(keep_input_file)
  {
    for(size_t i = 0; i < opts.size(); i += 2)
      _args += opts[i] + "=" + opts[i + 1] + " ";
  }